

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O3

void do_dungeon(char *infile,char *outfile)

{
  uchar uVar1;
  bool bVar2;
  bool bVar3;
  permonst *ppVar4;
  FILE *pFVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  undefined8 extraout_RAX;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  byte *pbVar13;
  char *extraout_RAX_00;
  char cVar14;
  long lVar15;
  undefined8 uVar16;
  byte *pbVar17;
  char *__filename;
  uint uVar18;
  ulong uVar19;
  msghdr *__filename_00;
  int *unaff_RBP;
  byte bVar20;
  byte bVar21;
  long lVar22;
  long *plVar23;
  qthdr *pqVar24;
  qthdr *__filename_01;
  char *__filename_02;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  char *unaff_R12;
  char *unaff_R13;
  permonst *ppVar29;
  char cVar30;
  char *pcVar31;
  qthdr *__filename_03;
  msghdr *unaff_R15;
  msghdr *__filename_04;
  char (*__s2) [3];
  char acStack_658 [256];
  long alStack_558 [33];
  char *pcStack_450;
  char *pcStack_448;
  char *pcStack_440;
  char *pcStack_438;
  msghdr *pmStack_430;
  code *pcStack_428;
  char *pcStack_420;
  msghdr *pmStack_418;
  char *pcStack_410;
  char *pcStack_408;
  qthdr *pqStack_400;
  msghdr *pmStack_3f8;
  code *pcStack_3f0;
  int iStack_3dc;
  char acStack_3d8 [264];
  qthdr *pqStack_2d0;
  char *pcStack_2c8;
  char *pcStack_2c0;
  qthdr *pqStack_2b8;
  msghdr *pmStack_2b0;
  code *pcStack_2a8;
  ulong uStack_298;
  char *pcStack_290;
  char *pcStack_288;
  qthdr *pqStack_280;
  msghdr *pmStack_278;
  code *pcStack_270;
  time_t tStack_260;
  char acStack_258 [64];
  char acStack_218 [64];
  undefined1 auStack_1d8 [64];
  char acStack_198 [256];
  qthdr *pqStack_98;
  char *pcStack_90;
  char *pcStack_88;
  qthdr *pqStack_80;
  msghdr *pmStack_78;
  undefined8 uStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *pcStack_58;
  qthdr *pqStack_50;
  msghdr *pmStack_48;
  code *pcStack_40;
  
  pcStack_40 = (code *)0x10a02c;
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010a131:
    pcStack_40 = (code *)0x10a139;
    do_dungeon_cold_3();
  }
  else {
    pcStack_40 = (code *)0x10a04b;
    ofp = (FILE *)fopen(outfile,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      pcStack_40 = (code *)0x10a06a;
      fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
      outfile = in_line;
      pcStack_40 = (code *)0x10a085;
      pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
      if (pcVar9 != (char *)0x0) {
        unaff_RBP = (int *)0x1;
        unaff_R15 = (msghdr *)0x4e5241434e494552;
        unaff_R12 = (char *)0x4e4f4954414e5241;
        unaff_R13 = in_line + 0xe;
        do {
          if (in_line[0] != '#') {
            pcVar9 = in_line;
            if (in_line[0] == '%') {
              pcVar9 = in_line + 0xe;
              if (CONCAT53(in_line._9_5_,in_line._6_3_) != 0x4e4f4954414e5241 ||
                  CONCAT44(in_line._5_4_,
                           CONCAT13(in_line[4],CONCAT12(in_line[3],CONCAT11(in_line[2],in_line[1])))
                          ) != 0x4e5241434e494552) {
                pcStack_40 = (code *)0x10a131;
                do_dungeon_cold_1();
                goto LAB_0010a131;
              }
            }
            pcStack_40 = (code *)0x10a0e6;
            fputs(pcVar9,(FILE *)ofp);
          }
          pcStack_40 = (code *)0x10a0fa;
          pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
          unaff_RBP = (int *)(ulong)((int)unaff_RBP + 1);
        } while (pcVar9 != (char *)0x0);
      }
      pcStack_40 = (code *)0x10a10d;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_40 = do_monstr;
  pqVar24 = (qthdr *)outfile;
  do_dungeon_cold_2();
  pcVar9 = "w+";
  pmStack_78 = (msghdr *)0x10a15b;
  uStack_70 = extraout_RAX;
  pcStack_68 = infile;
  pcStack_60 = unaff_R12;
  pcStack_58 = unaff_R13;
  pqStack_50 = (qthdr *)outfile;
  pmStack_48 = unaff_R15;
  pcStack_40 = (code *)unaff_RBP;
  ofp = (FILE *)fopen((char *)pqVar24,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    pmStack_78 = (msghdr *)0x10a17a;
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    pmStack_78 = (msghdr *)0x10a197;
    fwrite("#include \"config.h\"\n",0x14,1,(FILE *)ofp);
    pmStack_78 = (msghdr *)0x10a1b4;
    fwrite("\nconst int monstr[] = {\n",0x18,1,(FILE *)ofp);
    ppVar29 = mons;
    uVar18 = 0;
    do {
      uVar6 = (uint)ppVar29->mlevel;
      uVar28 = uVar6 * 2 - 0xc >> 2;
      if ((int)uVar6 < 0x32) {
        uVar28 = uVar6;
      }
      uVar6 = ppVar29->geno >> 5 & 2 | ppVar29->geno >> 7 & 1;
      lVar15 = 4;
      uStack_70 = CONCAT44(uVar18,(undefined4)uStack_70);
      do {
        uVar18 = (uint)ppVar29->mattk[lVar15 + -4].aatyp;
        if ((0xfd < uVar18) || ((0x9400U >> (uVar18 & 0x1f) & 1) != 0)) {
          uVar6 = uVar6 + 1;
          break;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 10);
      uVar18 = (uint)('\x11' < ppVar29->mmove) +
               ((byte)ppVar29->ac >> 7) + uVar6 + (uint)(ppVar29->ac < '\x04');
      lVar15 = 4;
      do {
        uVar1 = ppVar29->mattk[lVar15 + -4].aatyp;
        uVar6 = 0;
        if (uVar1 == 0xfe) {
          uVar6 = ppVar29->mflags2 >> 0x1a & 1;
        }
        uVar18 = ((uVar18 + 1) - (uint)(uVar1 == '\0')) + (uint)(uVar1 == 0xff) + uVar6;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 10);
      lVar15 = 0x13;
      do {
        bVar21 = *(byte *)((long)ppVar29->mattk + lVar15 + -0x12);
        if ((bVar21 < 0x20) && ((0xe0048080U >> (bVar21 & 0x1f) & 1) != 0)) {
          uVar18 = uVar18 + 2;
        }
        else {
          pmStack_78 = (msghdr *)0x10a2d1;
          iVar7 = strcmp(ppVar29->mname,"grid bug");
          if (iVar7 != 0) {
            uVar18 = (uVar18 + 1) - (uint)(bVar21 == 0);
          }
        }
        uVar18 = (uVar18 + 1) -
                 (uint)((uint)*(byte *)((long)ppVar29->mattk + lVar15 + -0x11) *
                        (uint)*(byte *)((long)&((permonst *)(ppVar29->mattk + -4))->mname + lVar15)
                       < 0x18);
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x2b);
      pmStack_78 = (msghdr *)0x10a2ee;
      iVar7 = strcmp(ppVar29->mname,"leprechaun");
      uVar6 = uVar18 - 2;
      if (iVar7 != 0) {
        uVar6 = uVar18;
      }
      if (uVar6 == 0) {
        uVar28 = uVar28 - 1;
      }
      else if ((int)uVar6 < 6) {
        uVar28 = uVar28 + (int)uVar6 / 3 + 1;
      }
      else {
        uVar28 = uVar28 + (uVar6 >> 1);
      }
      if ((int)uVar28 < 1) {
        uVar28 = 0;
      }
      uVar18 = uStack_70._4_4_ + 1;
      uVar16 = 0x20;
      if ((uVar18 & 0xf) == 0) {
        uVar16 = 10;
      }
      pmStack_78 = (msghdr *)0x10a366;
      fprintf((FILE *)ofp,"%2d,%c",(ulong)uVar28,uVar16);
      ppVar4 = ppVar29 + 1;
      ppVar29 = ppVar29 + 1;
      if (ppVar4->mlet == '\0') {
        pcVar9 = "\n";
        if ((uVar18 & 0xf) == 0) {
          pcVar9 = "";
        }
        pmStack_78 = (msghdr *)0x10a3ad;
        fprintf((FILE *)ofp,"%s};\n",pcVar9);
        pmStack_78 = (msghdr *)0x10a3ca;
        fwrite("\n/*monstr.c*/\n",0xe,1,(FILE *)ofp);
        fclose((FILE *)ofp);
        return;
      }
    } while( true );
  }
  pmStack_78 = (msghdr *)do_date;
  __filename_01 = pqVar24;
  do_monstr_cold_1();
  tStack_260 = 0;
  pcStack_270 = (code *)0x10a416;
  pqStack_98 = pqVar24;
  pcStack_90 = unaff_R12;
  pcStack_88 = unaff_R13;
  pqStack_80 = (qthdr *)outfile;
  pmStack_78 = unaff_R15;
  ofp = (FILE *)fopen((char *)__filename_01,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    pcStack_270 = (code *)0x10a435;
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    pcStack_270 = (code *)0x10a442;
    time(&tStack_260);
    pcStack_270 = (code *)0x10a44a;
    pcVar10 = ctime(&tStack_260);
    pcVar31 = acStack_258;
    pcStack_270 = (code *)0x10a45a;
    strcpy(pcVar31,pcVar10);
    for (; (*pcVar31 != '\0' && (*pcVar31 != '\n')); pcVar31 = pcVar31 + 1) {
    }
    *pcVar31 = '\0';
    if ((char)((ulong)pcVar9 & 0xffffffff) != '\0') {
      pcStack_270 = (code *)0x10a48e;
      fprintf((FILE *)ofp,"#define BUILD_DATE \"%s\"\n",acStack_258);
      pcStack_270 = (code *)0x10a4a8;
      fprintf((FILE *)ofp,"#define BUILD_TIME (%ldL)\n",tStack_260);
      pcStack_270 = (code *)0x10a4b9;
      fputc(10,(FILE *)ofp);
    }
    uVar16 = 0x60000;
    if (version_0 == '\0') {
      uVar16 = 0;
    }
    pcStack_270 = (code *)0x10a4df;
    fprintf((FILE *)ofp,"#define VERSION_NUMBER 0x%08xU\n",uVar16);
    pcStack_270 = (code *)0x10a4f6;
    fprintf((FILE *)ofp,"#define VERSION_FEATURES 0x%08xU\n",0);
    pcStack_270 = (code *)0x10a511;
    fprintf((FILE *)ofp,"#define VERSION_SANITY1 0x%08xU\n",(ulong)version_2);
    pcStack_270 = (code *)0x10a522;
    fputc(10,(FILE *)ofp);
    pFVar5 = ofp;
    pcStack_270 = (code *)0x10a54f;
    sprintf(acStack_198,"%d.%d.%d",0,6,0);
    pcStack_270 = (code *)0x10a563;
    fprintf((FILE *)pFVar5,"#define VERSION_STRING \"%s\"\n",acStack_198);
    pFVar5 = ofp;
    auStack_1d8[0] = 0;
    pcStack_270 = (code *)0x10a593;
    sprintf(acStack_218,"%d.%d.%d",0,6,0);
    pcStack_270 = (code *)0x10a5b6;
    sprintf(acStack_198,"%s DynaHack%s Version %s - last build %s.","Unix",auStack_1d8,acStack_218,
            acStack_258);
    pcStack_270 = (code *)0x10a5ca;
    fprintf((FILE *)pFVar5,"#define VERSION_ID \\\n \"%s\"\n",acStack_198);
    pcStack_270 = (code *)0x10a5db;
    fputc(10,(FILE *)ofp);
    pcStack_270 = (code *)0x10a5e7;
    fclose((FILE *)ofp);
    return;
  }
  pcStack_270 = do_permonst;
  pqVar24 = __filename_01;
  do_date_cold_1();
  pcVar31 = "w+";
  pcStack_2a8 = (code *)0x10a61a;
  uStack_298 = (ulong)pcVar9 & 0xffffffff;
  pcStack_290 = unaff_R12;
  pcStack_288 = unaff_R13;
  pqStack_280 = __filename_01;
  pmStack_278 = unaff_R15;
  pcStack_270 = (code *)unaff_RBP;
  ofp = (FILE *)fopen((char *)pqVar24,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    pcStack_2a8 = (code *)0x10a639;
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    pcStack_2a8 = (code *)0x10a656;
    fwrite("#ifndef PM_H\n#define PM_H\n",0x1a,1,(FILE *)ofp);
    pcStack_2a8 = (code *)0x10a66c;
    iVar7 = strcmp("giant ant","playermon");
    if (iVar7 != 0) {
      pcStack_2a8 = (code *)0x10a68d;
      fwrite("\n#define\tPM_PLAYERMON\t(-1)",0x1a,1,(FILE *)ofp);
    }
    cVar30 = '\x01';
    uVar19 = 0;
    ppVar29 = mons;
    do {
      pcStack_2a8 = (code *)0x10a6ca;
      fwrite("\n#define\tPM_",0xc,1,(FILE *)ofp);
      pcVar9 = ppVar29->mname;
      if (cVar30 == '5') {
        pcStack_2a8 = (code *)0x10a6e8;
        iVar7 = strncmp(pcVar9,"were",4);
        if (iVar7 == 0) {
          pcStack_2a8 = (code *)0x10a709;
          fwrite("HUMAN_",6,1,(FILE *)ofp);
        }
      }
      pcStack_2a8 = (code *)0x10a719;
      strncpy(&tmpdup_buf,pcVar9,0x7f);
      if (tmpdup_buf != '\0') {
        pcVar9 = &DAT_0014f2b1;
        cVar30 = tmpdup_buf;
        do {
          if ((byte)(cVar30 + 0x9fU) < 0x1a) {
            cVar14 = cVar30 + -0x20;
LAB_0010a743:
            pcVar9[-1] = cVar14;
          }
          else {
            cVar14 = '_';
            if ((byte)(cVar30 + 0xa5U) < 0xe6) goto LAB_0010a743;
          }
          cVar30 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while (cVar30 != '\0');
      }
      pcStack_2a8 = (code *)0x10a765;
      fprintf((FILE *)ofp,"%s\t%d",&tmpdup_buf,uVar19 & 0xffffffff);
      uVar19 = uVar19 + 1;
      ppVar29 = mons + uVar19;
      cVar30 = mons[uVar19].mlet;
      if (cVar30 == '\0') {
        pcStack_2a8 = (code *)0x10a79c;
        fprintf((FILE *)ofp,"\n\n#define\tNUMMONS\t%d\n",uVar19 & 0xffffffff);
        pcStack_2a8 = (code *)0x10a7b9;
        fwrite("\n#endif /* PM_H */\n",0x13,1,(FILE *)ofp);
        fclose((FILE *)ofp);
        return;
      }
    } while( true );
  }
  pcStack_2a8 = do_questtxt;
  __filename_00 = (msghdr *)pcVar31;
  __filename_03 = pqVar24;
  do_permonst_cold_1();
  pcVar9 = "r";
  pcStack_3f0 = (code *)0x10a7fe;
  pqStack_2d0 = pqVar24;
  pcStack_2c8 = unaff_R12;
  pcStack_2c0 = unaff_R13;
  pqStack_2b8 = __filename_01;
  pmStack_2b0 = unaff_R15;
  pcStack_2a8 = (code *)unaff_RBP;
  ifp = (FILE *)fopen((char *)__filename_03,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010ad6b:
    pcStack_3f0 = (code *)0x10ad73;
    do_questtxt_cold_7();
  }
  else {
    pcVar9 = "w+";
    pcStack_3f0 = (code *)0x10a81d;
    ofp = (FILE *)fopen((char *)__filename_00,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      qt_hdr.n_hdr = 0;
      qt_line = 0;
      in_msg = '\0';
      pcStack_3f0 = (code *)0x10a85a;
      pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
      if (pcVar9 != (char *)0x0) {
        unaff_R12 = "%s %5d";
        unaff_R13 = acStack_3d8;
        unaff_RBP = &iStack_3dc;
        unaff_R15 = msg_hdr;
        do {
          qt_line = qt_line + 1;
          __filename_03 = (qthdr *)(ulong)(uint)qt_line;
          if (in_line[0] != '#') {
            if (in_line[0] == '%') {
              if (in_line[1] == 'E') {
                iStack_3dc = 0;
                if (in_msg == '\0') {
                  pcVar9 = "End record encountered before message - line %d\n";
LAB_0010aa8b:
                  iStack_3dc = 0;
                  pcStack_3f0 = (code *)0x10aa95;
                  fprintf(_stderr,pcVar9,(ulong)(uint)qt_line);
                }
                else {
                  in_msg = '\0';
                }
              }
              else {
                if (in_line[1] != 'C') goto LAB_0010a9e7;
                iStack_3dc = 0;
                if (in_msg != '\0') {
                  pcVar9 = "Control record encountered during message - line %d\n";
                  goto LAB_0010aa8b;
                }
                in_msg = '\x01';
                pcStack_3f0 = (code *)0x10a8f8;
                iVar7 = __isoc99_sscanf(in_line + 4,"%s %5d",unaff_R13,unaff_RBP);
                if (iVar7 == 2) {
                  pcStack_3f0 = (code *)0x10a909;
                  iVar7 = get_hdr(unaff_R13);
                  if (iVar7 == 0) {
                    if (0xf < (long)qt_hdr.n_hdr) {
                      pcStack_3f0 = (code *)0x10aab1;
                      do_questtxt_cold_4();
                      goto LAB_0010aa48;
                    }
                    __filename_03 = &qt_hdr;
                    pcStack_3f0 = (code *)0x10a93e;
                    strncpy(qt_hdr.id[qt_hdr.n_hdr],unaff_R13,3);
                    lVar15 = (long)qt_hdr.n_hdr;
                    msg_hdr[lVar15].n_msg = 0;
                    qt_hdr.n_hdr = qt_hdr.n_hdr + 1;
                    qt_hdr.offset[lVar15] = 0;
                  }
                  pcStack_3f0 = (code *)0x10a96e;
                  iVar7 = get_hdr(unaff_R13);
                  lVar15 = (long)(iVar7 + -1);
                  lVar11 = lVar15 * 0x2ee8 + 0x1203f8;
                  iVar7 = msg_hdr[lVar15].n_msg;
                  lVar22 = (long)iVar7;
                  if (0 < lVar22) {
                    lVar25 = 0;
                    do {
                      if (*(int *)(lVar11 + lVar25) == iStack_3dc) {
                        pcStack_3f0 = (code *)0x10aaa3;
                        do_questtxt_cold_3();
                        goto LAB_0010aa48;
                      }
                      lVar25 = lVar25 + 0x18;
                    } while (lVar22 * 0x18 != lVar25);
                    if (499 < iVar7) {
                      pcStack_3f0 = (code *)0x10aaaa;
                      do_questtxt_cold_2();
                      goto LAB_0010aa48;
                    }
                  }
                  msg_hdr[lVar15].n_msg = iVar7 + 1;
                  curr_msg = (qtmsg *)(lVar11 + lVar22 * 0x18);
                  curr_msg->msgnum = iStack_3dc;
                  curr_msg->delivery = in_line[2];
                  curr_msg->offset = 0;
                  curr_msg->size = 0;
                }
                else {
                  pcStack_3f0 = (code *)0x10aa9c;
                  do_questtxt_cold_1();
                }
              }
            }
            else {
LAB_0010a9e7:
              if (in_msg == '\0') {
                pcStack_3f0 = (code *)0x10aa0d;
                sVar12 = strlen(in_line);
                if (sVar12 == 1) goto LAB_0010aa48;
                pcStack_3f0 = (code *)0x10aa2e;
                fprintf(_stderr,"Text encountered outside message - line %d\n",__filename_03);
              }
              pcStack_3f0 = (code *)0x10a9f8;
              sVar12 = strlen(in_line);
              curr_msg->size = curr_msg->size + sVar12;
            }
          }
LAB_0010aa48:
          pcStack_3f0 = (code *)0x10aa5c;
          pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
          __filename_00 = (msghdr *)in_line;
        } while (pcVar9 != (char *)0x0);
      }
      pcStack_3f0 = (code *)0x10aac3;
      fseek((FILE *)ifp,0,0);
      in_msg = '\0';
      lVar15 = (long)qt_hdr.n_hdr;
      if (0 < lVar15) {
        plVar23 = qt_hdr.offset;
        lVar11 = lVar15 * 0xb + 4;
        lVar22 = 0;
        do {
          *plVar23 = lVar11;
          lVar11 = lVar11 + (long)*(int *)((long)msg_hdr[0].qt_msg + lVar22 + -8) * 0x18 + 4;
          lVar22 = lVar22 + 0x2ee8;
          plVar23 = plVar23 + 1;
        } while (lVar15 * 0x2ee8 - lVar22 != 0);
        lVar22 = 0x120408;
        lVar25 = 0;
        lVar26 = 0;
        do {
          iVar7 = msg_hdr[lVar25].n_msg;
          if (0 < (long)iVar7) {
            lVar27 = 0;
            do {
              *(long *)(lVar22 + -8 + lVar27) = lVar26 + lVar11;
              lVar26 = lVar26 + *(long *)(lVar22 + lVar27);
              lVar27 = lVar27 + 0x18;
            } while ((long)iVar7 * 0x18 != lVar27);
          }
          lVar25 = lVar25 + 1;
          lVar22 = lVar22 + 0x2ee8;
        } while (lVar25 != lVar15);
      }
      pcVar9 = (char *)0x4;
      pcStack_3f0 = (code *)0x10ab8a;
      sVar12 = fwrite(&qt_hdr,4,1,(FILE *)ofp);
      if ((int)sVar12 == 1) {
        pcVar9 = (char *)0x3;
        pcStack_3f0 = (code *)0x10abb2;
        sVar12 = fwrite(qt_hdr.id,3,(long)qt_hdr.n_hdr,(FILE *)ofp);
        if (qt_hdr.n_hdr == (int)sVar12) {
          pcVar9 = (char *)0x8;
          pcStack_3f0 = (code *)0x10abd9;
          sVar12 = fwrite(qt_hdr.offset,8,(long)(int)sVar12,(FILE *)ofp);
          if (qt_hdr.n_hdr == (int)sVar12) {
            if (0 < (int)sVar12) {
              __filename_00 = msg_hdr;
              __filename_03 = (qthdr *)0x0;
              do {
                pcVar9 = (char *)0x4;
                pcStack_3f0 = (code *)0x10ac0c;
                sVar12 = fwrite(__filename_00,4,1,(FILE *)ofp);
                if ((int)sVar12 != 1) goto LAB_0010ad66;
                pcVar9 = (char *)0x18;
                pcStack_3f0 = (code *)0x10ac2d;
                sVar12 = fwrite(__filename_00->qt_msg,0x18,(long)__filename_00->n_msg,(FILE *)ofp);
                if (__filename_00->n_msg != (int)sVar12) goto LAB_0010ad66;
                __filename_03 = (qthdr *)((long)&__filename_03->n_hdr + 1);
                __filename_00 = __filename_00 + 1;
              } while ((long)__filename_03 < (long)qt_hdr.n_hdr);
            }
            pcStack_3f0 = (code *)0x10ac63;
            pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
            bVar21 = in_line[0];
            do {
              in_line[0] = bVar21;
              if (pcVar9 == (char *)0x0) {
                pcStack_3f0 = (code *)0x10ad48;
                fclose((FILE *)ifp);
                pcStack_3f0 = (code *)0x10ad54;
                fclose((FILE *)ofp);
                return;
              }
              if (bVar21 != 0x23) {
                if ((bVar21 == 0x25) && ((in_line[1] == 'E' || (in_line[1] == 'C')))) {
                  in_msg = in_line[1] == 'C';
                }
                else {
                  if (in_msg == '\0') {
                    pcStack_3f0 = (code *)0x10acce;
                    sVar12 = strlen(in_line);
                    if (sVar12 == 1) goto LAB_0010ad1f;
                  }
                  pbVar13 = &xcrypt_buf;
                  if (bVar21 != 0) {
                    iVar7 = 1;
                    pcVar9 = in_line;
                    pbVar13 = &xcrypt_buf;
                    do {
                      pcVar9 = (char *)((byte *)pcVar9 + 1);
                      bVar20 = (byte)iVar7;
                      if ((bVar21 & 0x60) == 0) {
                        bVar20 = 0;
                      }
                      *pbVar13 = bVar20 ^ bVar21;
                      iVar7 = iVar7 * 2;
                      if (0x1f < iVar7) {
                        iVar7 = 1;
                      }
                      pbVar13 = pbVar13 + 1;
                      bVar21 = *pcVar9;
                    } while (bVar21 != 0);
                  }
                  *pbVar13 = 0;
                  pcStack_3f0 = (code *)0x10ad1f;
                  fputs(&xcrypt_buf,(FILE *)ofp);
                }
              }
LAB_0010ad1f:
              pcStack_3f0 = (code *)0x10ad33;
              pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
              bVar21 = in_line[0];
            } while( true );
          }
        }
      }
LAB_0010ad66:
      pcStack_3f0 = (code *)0x10ad6b;
      do_questtxt_cold_5();
      goto LAB_0010ad6b;
    }
  }
  pcStack_3f0 = do_rumors;
  __filename_04 = __filename_00;
  do_questtxt_cold_6();
  pcStack_428 = (code *)0x10ad9e;
  pcStack_420 = extraout_RAX_00;
  pmStack_418 = __filename_00;
  pcStack_410 = unaff_R12;
  pcStack_408 = unaff_R13;
  pqStack_400 = __filename_03;
  pmStack_3f8 = unaff_R15;
  pcStack_3f0 = (code *)unaff_RBP;
  ofp = (FILE *)fopen(__filename,"w+");
  pcVar31 = __filename;
  if ((FILE *)ofp == (FILE *)0x0) {
    pcStack_428 = (code *)0x10afca;
    do_rumors_cold_3();
LAB_0010afca:
    pcStack_428 = (code *)0x10afd6;
    do_rumors_cold_2();
  }
  else {
    pcStack_428 = (code *)0x10adc1;
    pcStack_420 = __filename;
    fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
    pcStack_428 = (code *)0x10add0;
    ifp = (FILE *)fopen((char *)__filename_04,"r");
    if ((FILE *)ifp == (FILE *)0x0) goto LAB_0010afca;
    unaff_R13 = (char *)0x0;
    pcStack_428 = (code *)0x10adf2;
    fseek((FILE *)ifp,0,2);
    pcStack_428 = (code *)0x10adfe;
    lVar15 = ftell((FILE *)ifp);
    pcStack_428 = (code *)0x10ae16;
    fprintf((FILE *)ofp,"%06lx\n",lVar15);
    pcStack_428 = (code *)0x10ae26;
    fseek((FILE *)ifp,0,0);
    pcStack_428 = (code *)0x10ae3e;
    pcVar10 = fgets(in_line,0x100,(FILE *)ifp);
    if (pcVar10 != (char *)0x0) {
      __filename_04 = (msghdr *)&xcrypt_buf;
      unaff_R12 = in_line;
      unaff_RBP = (int *)(in_line + 1);
      pcVar31 = (char *)0x1;
      do {
        pbVar13 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar7 = 1;
          pcVar10 = in_line;
          pbVar13 = &xcrypt_buf;
          bVar21 = in_line[0];
          do {
            pcVar10 = (char *)((byte *)pcVar10 + 1);
            bVar20 = (byte)iVar7;
            if ((bVar21 & 0x60) == 0) {
              bVar20 = 0;
            }
            *pbVar13 = bVar20 ^ bVar21;
            iVar7 = iVar7 * 2;
            if (0x1f < iVar7) {
              iVar7 = 1;
            }
            pbVar13 = pbVar13 + 1;
            bVar21 = *pcVar10;
          } while (bVar21 != 0);
        }
        *pbVar13 = 0;
        pcStack_428 = (code *)0x10aeb3;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_428 = (code *)0x10aec7;
        pcVar10 = fgets(in_line,0x100,(FILE *)ifp);
      } while (pcVar10 != (char *)0x0);
    }
    pcStack_428 = (code *)0x10aed8;
    fclose((FILE *)ifp);
    pcStack_428 = (code *)0x10aee7;
    ifp = (FILE *)fopen(pcVar9,"r");
    if ((FILE *)ifp != (FILE *)0x0) {
      pcStack_428 = (code *)0x10af0b;
      pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
      bVar21 = in_line[0];
      while (in_line[0] = bVar21, pcVar9 != (char *)0x0) {
        pbVar13 = &xcrypt_buf;
        if (bVar21 != 0) {
          iVar7 = 1;
          pcVar9 = in_line;
          pbVar13 = &xcrypt_buf;
          do {
            pcVar9 = (char *)((byte *)pcVar9 + 1);
            bVar20 = (byte)iVar7;
            if ((bVar21 & 0x60) == 0) {
              bVar20 = 0;
            }
            *pbVar13 = bVar20 ^ bVar21;
            iVar7 = iVar7 * 2;
            if (0x1f < iVar7) {
              iVar7 = 1;
            }
            pbVar13 = pbVar13 + 1;
            bVar21 = *pcVar9;
          } while (bVar21 != 0);
        }
        *pbVar13 = 0;
        pcStack_428 = (code *)0x10af83;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_428 = (code *)0x10af97;
        pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
        bVar21 = in_line[0];
      }
      pcStack_428 = (code *)0x10afa8;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_428 = do_oracles;
  pcVar10 = pcStack_420;
  __filename_02 = pcVar9;
  do_rumors_cold_1();
  pcStack_450 = pcVar31;
  pcStack_448 = unaff_R12;
  pcStack_440 = unaff_R13;
  pcStack_438 = pcVar9;
  pmStack_430 = __filename_04;
  pcStack_428 = (code *)unaff_RBP;
  sprintf(acStack_658,"%s.%s",pcVar10,"tmp");
  ifp = (FILE *)fopen(__filename_02,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010b4f3:
    do_oracles_cold_4();
  }
  else {
    ofp = (FILE *)fopen(pcVar10,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      tfp = (FILE *)fopen(acStack_658,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar5 = ofp;
        lVar15 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar5,"%05lx\n",lVar15);
        lVar15 = 0;
        do {
          pbVar13 = (byte *)special_oracle[lVar15];
          bVar21 = *pbVar13;
          pbVar17 = &xcrypt_buf;
          if (bVar21 != 0) {
            iVar7 = 1;
            pbVar17 = &xcrypt_buf;
            do {
              pbVar13 = pbVar13 + 1;
              bVar20 = (byte)iVar7;
              if ((bVar21 & 0x60) == 0) {
                bVar20 = 0;
              }
              *pbVar17 = bVar20 ^ bVar21;
              iVar7 = iVar7 * 2;
              if (0x1f < iVar7) {
                iVar7 = 1;
              }
              pbVar17 = pbVar17 + 1;
              bVar21 = *pbVar13;
            } while (bVar21 != 0);
          }
          *pbVar17 = 0;
          fputs(&xcrypt_buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 10);
        fputs("---\n",(FILE *)tfp);
        pFVar5 = ofp;
        lVar15 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar5,"%05lx\n",lVar15);
        uVar18 = 1;
LAB_0010b1ac:
        bVar3 = true;
LAB_0010b1af:
        while (pcVar9 = fgets(in_line,0x100,(FILE *)ifp), pcVar9 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",alStack_558);
            if (in_line[4] == '-' &&
                CONCAT13(in_line[3],CONCAT12(in_line[2],CONCAT11(in_line[1],in_line[0]))) ==
                0x2d2d2d2d) goto code_r0x0010b1fb;
            pbVar13 = &xcrypt_buf;
            if (in_line[0] != '\0') {
              iVar7 = 1;
              pcVar9 = in_line;
              pbVar13 = &xcrypt_buf;
              bVar21 = in_line[0];
              do {
                pcVar9 = (char *)((byte *)pcVar9 + 1);
                bVar20 = (byte)iVar7;
                if ((bVar21 & 0x60) == 0) {
                  bVar20 = 0;
                }
                *pbVar13 = bVar20 ^ bVar21;
                iVar7 = iVar7 * 2;
                if (0x1f < iVar7) {
                  iVar7 = 1;
                }
                pbVar13 = pbVar13 + 1;
                bVar21 = *pcVar9;
              } while (bVar21 != 0);
            }
            *pbVar13 = 0;
            fputs(&xcrypt_buf,(FILE *)tfp);
            bVar3 = false;
          }
        }
        if (!bVar3) {
          uVar18 = uVar18 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar5 = ofp;
          lVar15 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar5,"%05lx\n",lVar15);
        }
        lVar15 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",acStack_658);
        iVar7 = fseek((FILE *)tfp,0,0);
        if (iVar7 == 0) {
          pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
          while (pcVar9 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
            pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
          }
          fclose((FILE *)tfp);
          unlink(acStack_658);
          sprintf(in_line,"rewind of \"%s\"",pcVar10);
          iVar7 = fseek((FILE *)ofp,0,0);
          if (iVar7 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",pcVar10);
            iVar7 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)uVar18);
            if (-1 < iVar7) {
              sprintf(in_line,"data rewrite of \"%s\"",pcVar10);
              iVar7 = uVar18 + 1;
              while ((((lVar11 = ftell((FILE *)ofp), -1 < lVar11 &&
                       (iVar8 = fseek((FILE *)ofp,lVar11,0), -1 < iVar8)) &&
                      (iVar8 = __isoc99_fscanf(ofp,"%5lx",alStack_558), iVar8 == 1)) &&
                     ((iVar8 = fseek((FILE *)ofp,lVar11,0), -1 < iVar8 &&
                      (iVar8 = fprintf((FILE *)ofp,"%05lx\n",alStack_558[0] + lVar15), -1 < iVar8)))
                     )) {
                iVar7 = iVar7 + -1;
                if (iVar7 == 0) {
                  fclose((FILE *)ofp);
                  return;
                }
              }
            }
          }
        }
        do_oracles_cold_1();
        goto LAB_0010b4f3;
      }
      goto LAB_0010b503;
    }
  }
  do_oracles_cold_3();
LAB_0010b503:
  pcVar9 = acStack_658;
  do_oracles_cold_2();
  lVar15 = (long)qt_hdr.n_hdr;
  if (0 < lVar15) {
    __s2 = qt_hdr.id;
    lVar11 = 0;
    do {
      iVar7 = strncmp(pcVar9,*__s2,3);
      if (iVar7 == 0) {
        return;
      }
      lVar11 = lVar11 + 1;
      __s2 = __s2 + 1;
    } while (lVar15 != lVar11);
  }
  return;
code_r0x0010b1fb:
  bVar2 = !bVar3;
  bVar3 = true;
  if (bVar2) goto LAB_0010b276;
  goto LAB_0010b1af;
LAB_0010b276:
  uVar18 = uVar18 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar5 = ofp;
  lVar15 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar5,"%05lx\n",lVar15);
  goto LAB_0010b1ac;
}

Assistant:

void do_dungeon(const char *infile, const char *outfile)
{
	int rcnt = 0;

	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp, "%s", Dont_Edit_Data);

	while (fgets(in_line, sizeof in_line, ifp) != 0) {
	    rcnt++;
	    if (in_line[0] == '#') continue;	/* discard comments */
recheck:
	    if (in_line[0] == '%') {
		int i = check_control(in_line);
		if (i >= 0) {
		    if (!deflist[i].true_or_false)  {
			while (fgets(in_line, sizeof in_line, ifp) != 0)
			    if (check_control(in_line) != i) goto recheck;
		    } else
			fputs(without_control(in_line),ofp);
		} else {
		    fprintf(stderr, "Unknown control option '%s' in file %s at line %d.\n",
			    in_line, infile, rcnt);
		    exit(EXIT_FAILURE);
		}
	    } else
		fputs(in_line,ofp);
	}
	fclose(ifp);
	fclose(ofp);

	return;
}